

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

posix_time __thiscall booster::locale::impl_icu::calendar_impl::get_time(calendar_impl *this)

{
  unique_lock<std::mutex> *in_RDI;
  UDate UVar1;
  double dVar2;
  posix_time pVar3;
  double secs;
  guard l;
  double rtime;
  UErrorCode code;
  posix_time res;
  mutex_type *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar4;
  uint local_8;
  
  uVar4 = 0;
  std::unique_lock<std::mutex>::unique_lock(in_RDI,in_stack_ffffffffffffff98);
  hold_ptr<icu_70::Calendar>::operator->((hold_ptr<icu_70::Calendar> *)(in_RDI + 5));
  UVar1 = icu_70::Calendar::getTime((Calendar *)in_RDI,(UErrorCode *)in_stack_ffffffffffffff98);
  std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  check_and_throw_dt((UErrorCode *)CONCAT44(uVar4,in_stack_ffffffffffffffe0));
  dVar2 = floor(UVar1 / 1000.0);
  pVar3.seconds = (long)dVar2;
  local_8 = (uint)(long)((UVar1 / 1000.0 - dVar2) / 1000000000.0);
  if (999999999 < local_8) {
    local_8 = 999999999;
  }
  pVar3.nanoseconds = local_8;
  pVar3._12_4_ = 0;
  return pVar3;
}

Assistant:

virtual posix_time get_time() const
        {
            
            UErrorCode code=U_ZERO_ERROR;
            double rtime = 0;
            {
                guard l(lock_);
                rtime = calendar_->getTime(code);
            }
            check_and_throw_dt(code);
            rtime/=1000.0;
            double secs = floor(rtime);
            posix_time res;
            res.seconds = static_cast<int64_t>(secs);
            res.nanoseconds = static_cast<uint32_t>((rtime - secs) / 1e9);
            if(res.nanoseconds > 999999999)
                res.nanoseconds = 999999999;
            return res;
        }